

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

void __thiscall SQLexer::LexLineComment(SQLexer *this)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = (*this->_readf)(this->_up);
    if ((long)uVar1 < 0x100) {
      if (uVar1 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
        this->_currentcolumn = this->_currentcolumn + 1;
        return;
      }
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    this->_currdata = (LexChar)uVar1;
    this->_currentcolumn = this->_currentcolumn + 1;
    if ((LexChar)uVar1 == '\n') break;
    if ((uVar1 & 0xff) == 0) {
      return;
    }
  }
  return;
}

Assistant:

void SQLexer::LexLineComment()
{
    do { NEXT(); } while (CUR_CHAR != _SC('\n') && (!IS_EOB()));
}